

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O2

Instr * __thiscall GlobOpt::OptPeep(GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val)

{
  OpCode OVar1;
  Opnd *pOVar2;
  BasicBlock *pBVar3;
  bool bVar4;
  Opnd *pOVar5;
  ByteCodeUsesInstr *this_00;
  RegOpnd *pRVar6;
  StackSym *sym;
  
  if (this->prePassLoop != (Loop *)0x0) {
    return instr;
  }
  OVar1 = instr->m_opcode;
  if (OVar1 - 0x1a0 < 3) {
    pOVar5 = instr->m_src1;
    pOVar2 = instr->m_src2;
    if ((src1Val == (Value *)0x0) ||
       (bVar4 = ValueType::IsPrimitive(&src1Val->valueInfo->super_ValueType), !bVar4)) {
      bVar4 = IR::Opnd::IsRegOpnd(pOVar5);
      if (!bVar4) {
        return instr;
      }
      pBVar3 = this->currentBlock;
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
      bVar4 = GlobOptBlockData::IsTypeSpecialized(&pBVar3->globOptData,&pRVar6->m_sym->super_Sym);
      if (!bVar4) {
        return instr;
      }
    }
    if ((src2Val == (Value *)0x0) ||
       (bVar4 = ValueType::IsPrimitive(&src2Val->valueInfo->super_ValueType), !bVar4)) {
      bVar4 = IR::Opnd::IsRegOpnd(pOVar2);
      if (!bVar4) {
        return instr;
      }
      pBVar3 = this->currentBlock;
      pRVar6 = IR::Opnd::AsRegOpnd(pOVar2);
      sym = pRVar6->m_sym;
LAB_00426c33:
      bVar4 = GlobOptBlockData::IsTypeSpecialized(&pBVar3->globOptData,&sym->super_Sym);
      if (!bVar4) {
        return instr;
      }
    }
LAB_00426c40:
    CaptureByteCodeSymUses(this,instr);
  }
  else {
    if (OVar1 != Ld_A) {
      if (OVar1 == DeadBrOnHasProperty) {
        pOVar5 = instr->m_src1;
        if ((src1Val == (Value *)0x0) ||
           (bVar4 = ValueType::IsPrimitive(&src1Val->valueInfo->super_ValueType), !bVar4)) {
          bVar4 = IR::Opnd::IsRegOpnd(pOVar5);
          if (!bVar4) {
            return instr;
          }
          pBVar3 = this->currentBlock;
          pRVar6 = IR::Opnd::AsRegOpnd(pOVar5);
          sym = pRVar6->m_sym;
          goto LAB_00426c33;
        }
        goto LAB_00426c40;
      }
      if (OVar1 != Ld_I4) {
        return instr;
      }
    }
    pOVar5 = instr->m_dst;
    pOVar2 = instr->m_src1;
    bVar4 = IR::Opnd::IsRegOpnd(pOVar5);
    if (!bVar4) {
      return instr;
    }
    bVar4 = IR::Opnd::IsEqual(pOVar5,pOVar2);
    if (!bVar4) {
      return instr;
    }
    pOVar5 = IR::Instr::UnlinkDst(instr);
    if ((pOVar5->field_0xb & 8) == 0) {
      this_00 = IR::ByteCodeUsesInstr::New(instr);
      IR::Instr::SetDst(&this_00->super_Instr,pOVar5);
      IR::Instr::InsertAfter(instr,&this_00->super_Instr);
    }
    IR::Instr::FreeSrc1(instr);
  }
  instr->m_opcode = Nop;
  return instr;
}

Assistant:

IR::Instr *
GlobOpt::OptPeep(IR::Instr *instr, Value *src1Val, Value *src2Val)
{
    IR::Opnd *dst, *src1, *src2;

    if (this->IsLoopPrePass())
    {
        return instr;
    }

    switch (instr->m_opcode)
    {
        case Js::OpCode::DeadBrEqual:
        case Js::OpCode::DeadBrRelational:
        case Js::OpCode::DeadBrSrEqual:
            src1 = instr->GetSrc1();
            src2 = instr->GetSrc2();

            // These branches were turned into dead branches because they were unnecessary (branch to next, ...).
            // The DeadBr are necessary in case the evaluation of the sources have side-effects.
            // If we know for sure the srcs are primitive or have been type specialized, we don't need these instructions
            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))) &&
                ((src2Val && src2Val->GetValueInfo()->IsPrimitive()) || (src2->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src2->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::DeadBrOnHasProperty:
            src1 = instr->GetSrc1();

            if (((src1Val && src1Val->GetValueInfo()->IsPrimitive()) || (src1->IsRegOpnd() && CurrentBlockData()->IsTypeSpecialized(src1->AsRegOpnd()->m_sym))))
            {
                this->CaptureByteCodeSymUses(instr);
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
        case Js::OpCode::Ld_A:
        case Js::OpCode::Ld_I4:
            src1 = instr->GetSrc1();
            dst = instr->GetDst();

            if (dst->IsRegOpnd() && dst->IsEqual(src1))
            {
                dst = instr->UnlinkDst();
                if (!dst->GetIsJITOptimizedReg())
                {
                    IR::ByteCodeUsesInstr *bytecodeUse = IR::ByteCodeUsesInstr::New(instr);
                    bytecodeUse->SetDst(dst);
                    instr->InsertAfter(bytecodeUse);
                }
                instr->FreeSrc1();
                instr->m_opcode = Js::OpCode::Nop;
            }
            break;
    }
    return instr;
}